

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

int __thiscall
CEditor::DoButton_Image
          (CEditor *this,void *pID,char *pText,int Checked,CUIRect *pRect,int Flags,char *pToolTip,
          bool Used)

{
  int iVar1;
  ITextRender *pIVar2;
  char *in_RDX;
  CEditor *in_RDI;
  CUI *in_R8;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  float fVar3;
  float extraout_XMM0_Da;
  float fVar4;
  vec4 vVar5;
  undefined1 in_stack_00000010;
  float FontSize;
  vec4 ButtonColor;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  float max;
  undefined1 MultiLine;
  float in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined3 in_stack_ffffffffffffffa8;
  uint uVar6;
  vector4_base<float> local_28;
  CUIRect *this_00;
  
  this_00 = *(CUIRect **)(in_FS_OFFSET + 0x28);
  uVar6 = CONCAT13(in_stack_00000010,in_stack_ffffffffffffffa8) & 0x1ffffff;
  vVar5 = GetButtonColor((CEditor *)
                         (CONCAT44(in_R9D,CONCAT13(in_stack_00000010,in_stack_ffffffffffffffa8)) &
                         0xffffffff01ffffff),
                         (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (int)((ulong)in_RDI >> 0x20));
  if ((uVar6 & 0x1000000) == 0) {
    vector4_base<float>::vector4_base(&local_28,0.5,0.5,0.5,1.0);
    vector4_base<float>::operator*=((vector4_base<float> *)&stack0xffffffffffffffe8,&local_28);
  }
  fVar3 = *(float *)&in_R8->m_pHotItem * 8.0;
  pIVar2 = TextRender(in_RDI);
  max = 10.0;
  (*(pIVar2->super_IInterface)._vptr_IInterface[6])(pIVar2,in_RDX,0xffffffff);
  fVar4 = clamp<float>(fVar3 / extraout_XMM0_Da,6.0,max);
  MultiLine = (undefined1)((uint)fVar3 >> 0x18);
  CUIRect::Draw(this_00,vVar5._8_8_,vVar5.field_1.y,(int)vVar5.field_0);
  UI(in_RDI);
  CUI::DoLabel(in_R8,(CUIRect *)CONCAT44(in_R9D,uVar6),
               (char *)CONCAT44(fVar4,in_stack_ffffffffffffffa0),(float)((ulong)in_RDI >> 0x20),
               (int)in_RDI,in_stack_ffffffffffffff94,(bool)MultiLine);
  iVar1 = DoButton_Editor_Common
                    ((CEditor *)CONCAT44(in_R9D,uVar6),
                     (void *)CONCAT44(fVar4,in_stack_ffffffffffffffa0),(char *)in_RDI,
                     (int)in_stack_ffffffffffffff94,
                     (CUIRect *)CONCAT44(max,in_stack_ffffffffffffff88),in_stack_ffffffffffffff84,
                     in_RDX);
  if (*(CUIRect **)(in_FS_OFFSET + 0x28) == this_00) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int CEditor::DoButton_Image(const void *pID, const char *pText, int Checked, const CUIRect *pRect, int Flags, const char *pToolTip, bool Used)
{
	// darken the button if not used
	vec4 ButtonColor = GetButtonColor(pID, Checked);
	if(!Used)
		ButtonColor *= vec4(0.5f, 0.5f, 0.5f, 1.0f);

	const float FontSize = clamp(8.0f * pRect->w / TextRender()->TextWidth(10.0f, pText, -1), 6.0f, 10.0f);
	pRect->Draw(ButtonColor, 3.0f);
	UI()->DoLabel(pRect, pText, FontSize, TEXTALIGN_MC);
	return DoButton_Editor_Common(pID, pText, Checked, pRect, Flags, pToolTip);
}